

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  complex<double> *pcVar1;
  int64_t row;
  long lVar2;
  int64_t iVar3;
  complex<double> **ppcVar4;
  TPZBaseMatrix *in_RSI;
  complex<double> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  complex<double> *BPtr;
  complex<double> *end_ki;
  complex<double> *elem_ki;
  complex<double> sum;
  int64_t k;
  int64_t j;
  int64_t dimension;
  char *in_stack_00000158;
  char *in_stack_00000160;
  complex<double> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  bool bVar5;
  undefined1 uVar6;
  complex<double> *__y;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff80;
  complex<double> *local_50;
  complex<double> local_48;
  complex<double> local_38;
  long local_28;
  complex<double> *local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  row = TPZBaseMatrix::Rows(in_RSI);
  lVar2 = (**(code **)(*(long *)in_RDI->_M_value + 0x60))();
  if ((row != lVar2) || (in_RDI[1]._M_value[8] != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error(in_stack_00000160,in_stack_00000158);
  }
  local_18 = (**(code **)(*(long *)in_RDI->_M_value + 0x60))();
  local_20 = (complex<double> *)0x0;
  while( true ) {
    __y = local_20;
    iVar3 = TPZBaseMatrix::Cols(local_10);
    if (iVar3 <= (long)__y) break;
    local_28 = 0;
    while( true ) {
      bVar5 = false;
      if (local_28 < local_18) {
        in_stack_ffffffffffffff58 =
             TPZFMatrix<std::complex<double>_>::operator()
                       (in_stack_ffffffffffffff80,row,(int64_t)in_RDI);
        std::complex<double>::complex(&local_38,0.0,0.0);
        bVar5 = std::operator==(in_RDI,__y);
      }
      if (bVar5 == false) break;
      local_28 = local_28 + 1;
    }
    uVar6 = 0;
    for (; local_28 < local_18; local_28 = local_28 + 1) {
      std::complex<double>::complex(&local_48,0.0,0.0);
      ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 2),local_28);
      local_50 = *ppcVar4;
      ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                          ((TPZVec<std::complex<double>_*> *)(in_RDI + 2),local_28 + 1);
      pcVar1 = *ppcVar4;
      TPZFMatrix<std::complex<double>_>::operator()(in_stack_ffffffffffffff80,row,(int64_t)in_RDI);
      while (local_50 = local_50 + 1, local_50 < pcVar1) {
        std::conj<double>((complex<double> *)CONCAT17(uVar6,in_stack_ffffffffffffff60));
        in_stack_ffffffffffffff80 =
             (TPZFMatrix<std::complex<double>_> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        std::operator*(in_stack_ffffffffffffff58,(complex<double> *)0x137dcc4);
        std::complex<double>::operator+=
                  ((complex<double> *)CONCAT17(uVar6,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
      }
      TPZFMatrix<std::complex<double>_>::operator()(in_stack_ffffffffffffff80,row,(int64_t)in_RDI);
      std::complex<double>::operator-=
                ((complex<double> *)CONCAT17(uVar6,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      TPZVec<std::complex<double>_*>::operator[]
                ((TPZVec<std::complex<double>_*> *)(in_RDI + 2),local_28);
      std::complex<double>::operator/=(in_RDI,__y);
    }
    local_20 = (complex<double> *)(local_20->_M_value + 1);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}